

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t create_filesystem_object(archive_write_disk *a)

{
  __mode_t __mode;
  byte *pbVar1;
  uint uVar2;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *path;
  wchar_t *pwVar7;
  dev_t __dev;
  wchar_t wVar8;
  archive_entry *entry;
  uint __mode_00;
  wchar_t error_number;
  stat st;
  wchar_t local_dc;
  archive_string local_d8;
  stat local_b8;
  
  pcVar6 = archive_entry_hardlink(a->entry);
  if (pcVar6 != (char *)0x0) {
    local_d8.s = (char *)0x0;
    local_d8.length = 0;
    local_d8.buffer_length = 0;
    path = strdup(pcVar6);
    if (path == (char *)0x0) {
      return L'\x01';
    }
    wVar3 = cleanup_pathname_fsobj(path,&local_dc,&local_d8,a->flags);
    if ((wVar3 != L'\0') ||
       (wVar3 = check_symlinks_fsobj(path,&local_dc,&local_d8,a->flags,L'\x01'), wVar3 != L'\0')) {
      archive_set_error(&a->archive,local_dc,"%s",local_d8.s);
      free(path);
      archive_string_free(&local_d8);
      return L'\x01';
    }
    free(path);
    archive_string_free(&local_d8);
    if ((a->flags & L'\x00040000') != L'\0') {
      unlink(a->name);
    }
    iVar4 = linkat(-100,pcVar6,-100,a->name,0);
    if (iVar4 != 0) {
      pwVar7 = __errno_location();
      if (*pwVar7 != L'\0') {
        return *pwVar7;
      }
    }
    if (a->filesize < 1) {
      a->todo = L'\0';
      a->deferred = L'\0';
      return L'\0';
    }
    iVar4 = lstat(a->name,&local_b8);
    if (iVar4 == 0) {
      if ((local_b8.st_mode & 0xf000) != 0x8000) {
        return L'\0';
      }
      wVar3 = open(a->name,0xa0201);
      a->fd = wVar3;
      __archive_ensure_cloexec_flag(wVar3);
      if (L'\xffffffff' < a->fd) {
        return L'\0';
      }
    }
    goto LAB_00265a32;
  }
  pcVar6 = archive_entry_symlink(a->entry);
  if (pcVar6 != (char *)0x0) {
    if ((a->flags & L'\x00040000') != L'\0') {
      unlink(a->name);
    }
    iVar4 = symlink(pcVar6,a->name);
    if (iVar4 == 0) {
      return L'\0';
    }
    goto LAB_00265a32;
  }
  uVar2 = a->mode;
  __mode_00 = ~a->user_umask & uVar2 & 0x1ff;
  if ((a->user_uid != 0) && ((a->todo & L'肀') != L'\0')) {
    __mode_00 = __mode_00 | 0x80;
  }
  switch((uVar2 & 0xf000) - 0x1000 >> 0xc) {
  case 0:
    uVar5 = mkfifo(a->name,__mode_00);
    break;
  case 1:
    entry = a->entry;
    pcVar6 = a->name;
    __mode = __mode_00 + 0x2000;
    goto LAB_002659e3;
  default:
    a->tmpname = (char *)0x0;
    wVar3 = open(a->name,0x800c1,(ulong)__mode_00);
    a->fd = wVar3;
    __archive_ensure_cloexec_flag(wVar3);
    uVar5 = (uint)a->fd >> 0x1f;
    break;
  case 3:
    __mode_00 = __mode_00 & 0x3d | 0x1c0;
    iVar4 = mkdir(a->name,__mode_00);
    if (iVar4 != 0) goto LAB_00265a32;
    wVar3 = a->todo;
    wVar8 = wVar3 & 4U | a->deferred;
    a->deferred = wVar8;
    if ((__mode_00 != (uVar2 & 0xfff)) || ((a->flags & L'\x02') != L'\0')) {
      a->deferred = wVar8 | wVar3 & 0x34000000U;
    }
    a->todo = wVar3 & 0xcbfffffb;
    goto LAB_00265a4b;
  case 5:
    entry = a->entry;
    pcVar6 = a->name;
    __mode = __mode_00 + 0x6000;
LAB_002659e3:
    __dev = archive_entry_rdev(entry);
    uVar5 = mknod(pcVar6,__mode,__dev);
  }
  if (uVar5 == 0) {
LAB_00265a4b:
    wVar3 = L'\0';
    if (__mode_00 == (uVar2 & 0xfff)) {
      pbVar1 = (byte *)((long)&a->todo + 3);
      *pbVar1 = *pbVar1 & 0xcb;
    }
  }
  else {
LAB_00265a32:
    pwVar7 = __errno_location();
    wVar3 = *pwVar7;
  }
  return wVar3;
}

Assistant:

static int
create_filesystem_object(struct archive_write_disk *a)
{
	/* Create the entry. */
	const char *linkname;
	mode_t final_mode, mode;
	int r;
	/* these for check_symlinks_fsobj */
	char *linkname_copy;	/* non-const copy of linkname */
	struct stat st;
	struct archive_string error_string;
	int error_number;

	/* We identify hard/symlinks according to the link names. */
	/* Since link(2) and symlink(2) don't handle modes, we're done here. */
	linkname = archive_entry_hardlink(a->entry);
	if (linkname != NULL) {
#if !HAVE_LINK
		return (EPERM);
#else
		archive_string_init(&error_string);
		linkname_copy = strdup(linkname);
		if (linkname_copy == NULL) {
		    return (EPERM);
		}
		/*
		 * TODO: consider using the cleaned-up path as the link
		 * target?
		 */
		r = cleanup_pathname_fsobj(linkname_copy, &error_number,
		    &error_string, a->flags);
		if (r != ARCHIVE_OK) {
			archive_set_error(&a->archive, error_number, "%s",
			    error_string.s);
			free(linkname_copy);
			archive_string_free(&error_string);
			/*
			 * EPERM is more appropriate than error_number for our
			 * callers
			 */
			return (EPERM);
		}
		r = check_symlinks_fsobj(linkname_copy, &error_number,
		    &error_string, a->flags, 1);
		if (r != ARCHIVE_OK) {
			archive_set_error(&a->archive, error_number, "%s",
			    error_string.s);
			free(linkname_copy);
			archive_string_free(&error_string);
			/*
			 * EPERM is more appropriate than error_number for our
			 * callers
			 */
			return (EPERM);
		}
		free(linkname_copy);
		archive_string_free(&error_string);
		/*
		 * Unlinking and linking here is really not atomic,
		 * but doing it right, would require us to construct
		 * an mktemplink() function, and then use rename(2).
		 */
		if (a->flags & ARCHIVE_EXTRACT_SAFE_WRITES)
			unlink(a->name);
#ifdef HAVE_LINKAT
		r = linkat(AT_FDCWD, linkname, AT_FDCWD, a->name,
		    0) ? errno : 0;
#else
		r = link(linkname, a->name) ? errno : 0;
#endif
		/*
		 * New cpio and pax formats allow hardlink entries
		 * to carry data, so we may have to open the file
		 * for hardlink entries.
		 *
		 * If the hardlink was successfully created and
		 * the archive doesn't have carry data for it,
		 * consider it to be non-authoritative for meta data.
		 * This is consistent with GNU tar and BSD pax.
		 * If the hardlink does carry data, let the last
		 * archive entry decide ownership.
		 */
		if (r == 0 && a->filesize <= 0) {
			a->todo = 0;
			a->deferred = 0;
		} else if (r == 0 && a->filesize > 0) {
#ifdef HAVE_LSTAT
			r = lstat(a->name, &st);
#else
			r = la_stat(a->name, &st);
#endif
			if (r != 0)
				r = errno;
			else if ((st.st_mode & AE_IFMT) == AE_IFREG) {
				a->fd = open(a->name, O_WRONLY | O_TRUNC |
				    O_BINARY | O_CLOEXEC | O_NOFOLLOW);
				__archive_ensure_cloexec_flag(a->fd);
				if (a->fd < 0)
					r = errno;
			}
		}
		return (r);
#endif
	}
	linkname = archive_entry_symlink(a->entry);
	if (linkname != NULL) {
#if HAVE_SYMLINK
		/*
		 * Unlinking and linking here is really not atomic,
		 * but doing it right, would require us to construct
		 * an mktempsymlink() function, and then use rename(2).
		 */
		if (a->flags & ARCHIVE_EXTRACT_SAFE_WRITES)
			unlink(a->name);
		return symlink(linkname, a->name) ? errno : 0;
#else
		return (EPERM);
#endif
	}

	/*
	 * The remaining system calls all set permissions, so let's
	 * try to take advantage of that to avoid an extra chmod()
	 * call.  (Recall that umask is set to zero right now!)
	 */

	/* Mode we want for the final restored object (w/o file type bits). */
	final_mode = a->mode & 07777;
	/*
	 * The mode that will actually be restored in this step.  Note
	 * that SUID, SGID, etc, require additional work to ensure
	 * security, so we never restore them at this point.
	 */
	mode = final_mode & 0777 & ~a->user_umask;

	/* 
	 * Always create writable such that [f]setxattr() works if we're not
	 * root.
	 */
	if (a->user_uid != 0 &&
	    a->todo & (TODO_HFS_COMPRESSION | TODO_XATTR)) {
		mode |= 0200;
	}

	switch (a->mode & AE_IFMT) {
	default:
		/* POSIX requires that we fall through here. */
		/* FALLTHROUGH */
	case AE_IFREG:
		a->tmpname = NULL;
		a->fd = open(a->name,
		    O_WRONLY | O_CREAT | O_EXCL | O_BINARY | O_CLOEXEC, mode);
		__archive_ensure_cloexec_flag(a->fd);
		r = (a->fd < 0);
		break;
	case AE_IFCHR:
#ifdef HAVE_MKNOD
		/* Note: we use AE_IFCHR for the case label, and
		 * S_IFCHR for the mknod() call.  This is correct.  */
		r = mknod(a->name, mode | S_IFCHR,
		    archive_entry_rdev(a->entry));
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a char device node. */
		return (EINVAL);
#endif /* HAVE_MKNOD */
	case AE_IFBLK:
#ifdef HAVE_MKNOD
		r = mknod(a->name, mode | S_IFBLK,
		    archive_entry_rdev(a->entry));
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a block device node. */
		return (EINVAL);
#endif /* HAVE_MKNOD */
	case AE_IFDIR:
		mode = (mode | MINIMUM_DIR_MODE) & MAXIMUM_DIR_MODE;
		r = mkdir(a->name, mode);
		if (r == 0) {
			/* Defer setting dir times. */
			a->deferred |= (a->todo & TODO_TIMES);
			a->todo &= ~TODO_TIMES;
			/* Never use an immediate chmod(). */
			/* We can't avoid the chmod() entirely if EXTRACT_PERM
			 * because of SysV SGID inheritance. */
			if ((mode != final_mode)
			    || (a->flags & ARCHIVE_EXTRACT_PERM))
				a->deferred |= (a->todo & TODO_MODE);
			a->todo &= ~TODO_MODE;
		}
		break;
	case AE_IFIFO:
#ifdef HAVE_MKFIFO
		r = mkfifo(a->name, mode);
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a fifo. */
		return (EINVAL);
#endif /* HAVE_MKFIFO */
	}

	/* All the system calls above set errno on failure. */
	if (r)
		return (errno);

	/* If we managed to set the final mode, we've avoided a chmod(). */
	if (mode == final_mode)
		a->todo &= ~TODO_MODE;
	return (0);
}